

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

Ssw_Sml_t * Ssw_SmlStart(Aig_Man_t *pAig,int nPref,int nFrames,int nWordsFrame)

{
  int iVar1;
  Ssw_Sml_t *__s;
  Ssw_Sml_t *p;
  int nWordsFrame_local;
  int nFrames_local;
  int nPref_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  __s = (Ssw_Sml_t *)malloc((long)iVar1 * 4 * (long)(nPref + nFrames) * (long)nWordsFrame + 0x30);
  memset(__s,0,(long)(nPref + nFrames) * 4 * (long)nWordsFrame + 0x30);
  __s->pAig = pAig;
  __s->nPref = nPref;
  __s->nFrames = nPref + nFrames;
  __s->nWordsFrame = nWordsFrame;
  __s->nWordsTotal = (nPref + nFrames) * nWordsFrame;
  __s->nWordsPref = nPref * nWordsFrame;
  return __s;
}

Assistant:

Ssw_Sml_t * Ssw_SmlStart( Aig_Man_t * pAig, int nPref, int nFrames, int nWordsFrame )
{
    Ssw_Sml_t * p;
    p = (Ssw_Sml_t *)ABC_ALLOC( char, sizeof(Ssw_Sml_t) + sizeof(unsigned) * Aig_ManObjNumMax(pAig) * (nPref + nFrames) * nWordsFrame );
    memset( p, 0, sizeof(Ssw_Sml_t) + sizeof(unsigned) * (nPref + nFrames) * nWordsFrame );
    p->pAig        = pAig;
    p->nPref       = nPref;
    p->nFrames     = nPref + nFrames;
    p->nWordsFrame = nWordsFrame;
    p->nWordsTotal = (nPref + nFrames) * nWordsFrame;
    p->nWordsPref  = nPref * nWordsFrame;
    return p;
}